

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::GoniometricLight::Phi(GoniometricLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  Tuple2<pbrt::Point2,_int> wrapMode;
  Point2i PVar4;
  DenselySampledSpectrum *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar14 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  SampledSpectrum SVar23;
  int u;
  Float sinTheta;
  int v;
  int height;
  int width;
  Float sumY;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Float a;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar24;
  Float in_stack_fffffffffffffee4;
  DenselySampledSpectrum *in_stack_fffffffffffffee8;
  ImageChannelValues *this_00;
  undefined4 in_stack_fffffffffffffef8;
  Float in_stack_fffffffffffffefc;
  ImageChannelValues local_78;
  int local_48;
  Float local_44;
  int local_40;
  int local_3c;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  
  uVar28 = 0;
  wrapMode = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 5));
  iVar27 = wrapMode.x;
  PVar4 = Image::Resolution((Image *)(in_RDI + 5));
  local_3c = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
  iVar25 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
  iVar26 = iVar25;
  for (local_40 = 0; auVar22 = in_ZMM1._8_56_, local_40 < iVar26; local_40 = local_40 + 1) {
    in_ZMM1 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),(float)iVar26));
    auVar6._0_4_ = (((float)local_40 + 0.5) * 3.1415927) / (float)iVar26;
    auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar5 = std::sin(auVar6._0_8_);
    local_44 = SUB84(dVar5,0);
    for (local_48 = 0; local_48 < iVar27; local_48 = local_48 + 1) {
      in_stack_fffffffffffffee8 = in_RDI + 5;
      in_stack_fffffffffffffee4 = local_44;
      Point2<int>::Point2((Point2<int> *)CONCAT44(local_44,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      this_00 = &local_78;
      PVar4.super_Tuple2<pbrt::Point2,_int>.y = uVar28;
      PVar4.super_Tuple2<pbrt::Point2,_int>.x = iVar27;
      Image::GetChannels((Image *)CONCAT44(iVar26,iVar25),PVar4,(WrapMode2D)wrapMode);
      in_stack_fffffffffffffefc = ImageChannelValues::Average(this_00);
      in_ZMM1 = ZEXT464((uint)in_stack_fffffffffffffee4);
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffefc),
                               ZEXT416((uint)in_stack_fffffffffffffee4),ZEXT416(uVar28));
      uVar28 = auVar6._0_4_;
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x6f60bb);
    }
  }
  a = *(Float *)&in_RDI[4].values.nStored;
  auVar14 = (undefined1  [56])0x0;
  SVar23 = DenselySampledSpectrum::Sample
                     (in_RDI,(SampledWavelengths *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  auVar15._0_8_ = SVar23.values.values._8_8_;
  auVar15._8_56_ = auVar22;
  auVar7._0_8_ = SVar23.values.values._0_8_;
  auVar7._8_56_ = auVar14;
  auVar14 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  SVar23 = pbrt::operator*(in_stack_fffffffffffffee4,
                           (SampledSpectrum *)CONCAT44(a,in_stack_fffffffffffffed8));
  auVar16._0_8_ = SVar23.values.values._8_8_;
  auVar16._8_56_ = auVar22;
  auVar8._0_8_ = SVar23.values.values._0_8_;
  auVar8._8_56_ = auVar14;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar16._0_16_);
  auVar14 = (undefined1  [56])0x0;
  SVar23 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),a);
  auVar17._0_8_ = SVar23.values.values._8_8_;
  auVar17._8_56_ = auVar22;
  auVar9._0_8_ = SVar23.values.values._0_8_;
  auVar9._8_56_ = auVar14;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar17._0_16_);
  auVar14 = (undefined1  [56])0x0;
  uVar24 = 0x40490fdb;
  SVar23 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffee4,0x40490fdb),a);
  auVar18._0_8_ = SVar23.values.values._8_8_;
  auVar18._8_56_ = auVar22;
  auVar10._0_8_ = SVar23.values.values._0_8_;
  auVar10._8_56_ = auVar14;
  auVar14 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar18._0_16_);
  SVar23 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffee4,uVar24),a);
  auVar19._0_8_ = SVar23.values.values._8_8_;
  auVar19._8_56_ = auVar22;
  auVar11._0_8_ = SVar23.values.values._0_8_;
  auVar11._8_56_ = auVar14;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar19._0_16_);
  auVar14 = (undefined1  [56])0x0;
  SVar23 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffee4,uVar24),a);
  auVar20._0_8_ = SVar23.values.values._8_8_;
  auVar20._8_56_ = auVar22;
  auVar12._0_8_ = SVar23.values.values._0_8_;
  auVar12._8_56_ = auVar14;
  vmovlpd_avx(auVar12._0_16_);
  vmovlpd_avx(auVar20._0_16_);
  auVar14 = ZEXT856(auVar14._0_8_);
  SVar23 = SampledSpectrum::operator/
                     ((SampledSpectrum *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  auVar21._0_8_ = SVar23.values.values._8_8_;
  auVar21._8_56_ = auVar22;
  auVar13._0_8_ = SVar23.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  uVar2 = vmovlpd_avx(auVar21._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum GoniometricLight::Phi(const SampledWavelengths &lambda) const {
    // integrate over speherical coordinates [0,Pi], [0,2pi]
    Float sumY = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
    }
    return scale * I.Sample(lambda) * 2 * Pi * Pi * sumY / (width * height);
}